

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

ARTKey duckdb::ARTKey::CreateKey(ArenaAllocator *allocator,PhysicalType type,Value *value)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  ARTKey AVar2;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    AVar2 = CreateARTKey<bool>(allocator,value);
    return AVar2;
  case 2:
    AVar2 = CreateARTKey<unsigned_char>(allocator,value);
    return AVar2;
  case 3:
    AVar2 = CreateARTKey<signed_char>(allocator,value);
    return AVar2;
  case 4:
    AVar2 = CreateARTKey<unsigned_short>(allocator,value);
    return AVar2;
  case 5:
    AVar2 = CreateARTKey<short>(allocator,value);
    return AVar2;
  case 6:
    AVar2 = CreateARTKey<unsigned_int>(allocator,value);
    return AVar2;
  case 7:
    AVar2 = CreateARTKey<int>(allocator,value);
    return AVar2;
  case 8:
    AVar2 = CreateARTKey<unsigned_long>(allocator,value);
    return AVar2;
  case 9:
    AVar2 = CreateARTKey<long>(allocator,value);
    return AVar2;
  case 10:
    goto switchD_009f23d6_caseD_a;
  case 0xb:
    AVar2 = CreateARTKey<float>(allocator,value);
    return AVar2;
  case 0xc:
    AVar2 = CreateARTKey<double>(allocator,value);
    return AVar2;
  default:
    if (iVar1 == 200) {
      AVar2 = CreateARTKey<duckdb::string_t>(allocator,value);
      return AVar2;
    }
    if (iVar1 == 0xcb) {
      AVar2 = CreateARTKey<duckdb::uhugeint_t>(allocator,value);
      return AVar2;
    }
    if (iVar1 == 0xcc) {
      AVar2 = CreateARTKey<duckdb::hugeint_t>(allocator,value);
      return AVar2;
    }
switchD_009f23d6_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Invalid type for the ART key.",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

ARTKey ARTKey::CreateKey(ArenaAllocator &allocator, PhysicalType type, Value &value) {
	D_ASSERT(type == value.type().InternalType());
	switch (type) {
	case PhysicalType::BOOL:
		return ARTKey::CreateARTKey<bool>(allocator, value);
	case PhysicalType::INT8:
		return ARTKey::CreateARTKey<int8_t>(allocator, value);
	case PhysicalType::INT16:
		return ARTKey::CreateARTKey<int16_t>(allocator, value);
	case PhysicalType::INT32:
		return ARTKey::CreateARTKey<int32_t>(allocator, value);
	case PhysicalType::INT64:
		return ARTKey::CreateARTKey<int64_t>(allocator, value);
	case PhysicalType::UINT8:
		return ARTKey::CreateARTKey<uint8_t>(allocator, value);
	case PhysicalType::UINT16:
		return ARTKey::CreateARTKey<uint16_t>(allocator, value);
	case PhysicalType::UINT32:
		return ARTKey::CreateARTKey<uint32_t>(allocator, value);
	case PhysicalType::UINT64:
		return ARTKey::CreateARTKey<uint64_t>(allocator, value);
	case PhysicalType::INT128:
		return ARTKey::CreateARTKey<hugeint_t>(allocator, value);
	case PhysicalType::UINT128:
		return ARTKey::CreateARTKey<uhugeint_t>(allocator, value);
	case PhysicalType::FLOAT:
		return ARTKey::CreateARTKey<float>(allocator, value);
	case PhysicalType::DOUBLE:
		return ARTKey::CreateARTKey<double>(allocator, value);
	case PhysicalType::VARCHAR:
		return ARTKey::CreateARTKey<string_t>(allocator, value);
	default:
		throw InternalException("Invalid type for the ART key.");
	}
}